

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O3

bool __thiscall ON_Hatch::IsValid(ON_Hatch *this,ON_TextLog *text_log)

{
  ON_HatchLoop *this_00;
  bool bVar1;
  char *format;
  ulong uVar2;
  ulong uVar3;
  
  bVar1 = ON_Plane::IsValid(&this->m_plane);
  if (bVar1) {
    uVar2 = (ulong)(this->m_loops).m_count;
    if (0 < (long)uVar2) {
      bVar1 = true;
      uVar3 = 0;
      do {
        this_00 = (this->m_loops).m_a[uVar3];
        if (this_00 == (ON_HatchLoop *)0x0) {
          if (text_log != (ON_TextLog *)0x0) {
            format = "Loop[%d] is nullptr\n";
LAB_004980d3:
            ON_TextLog::Print(text_log,format,uVar3 & 0xffffffff);
            return false;
          }
          goto LAB_004980e4;
        }
        if (bVar1 != false) {
          bVar1 = ON_HatchLoop::IsValid(this_00,text_log);
        }
        if (bVar1 == false) {
          if (text_log != (ON_TextLog *)0x0) {
            format = "Loop[%d] is not valid\n";
            goto LAB_004980d3;
          }
          goto LAB_004980e4;
        }
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
    bVar1 = true;
  }
  else if (text_log == (ON_TextLog *)0x0) {
LAB_004980e4:
    bVar1 = false;
  }
  else {
    bVar1 = false;
    ON_TextLog::Print(text_log,"Plane is not valid\n");
  }
  return bVar1;
}

Assistant:

bool ON_Hatch::IsValid( ON_TextLog* text_log) const
{
  bool rc = m_plane.IsValid();
  if( !rc)
  {
    if( text_log)
      text_log->Print( "Plane is not valid\n");
    return false;
  }
  // 18 June 2012 - Lowell - Added loop self-intersection and 
  // intersecting other loops tests
  int count = m_loops.Count();
  for(int i = 0; i < count; i++)
  {
    if(m_loops[i] == 0)
    {
      if( text_log)
        text_log->Print( "Loop[%d] is nullptr\n", i);
      return false;
    }
    if(rc)
      rc = m_loops[i]->IsValid( text_log);
    if( !rc)
    {
      if( text_log)
        text_log->Print( "Loop[%d] is not valid\n", i);
      return false;
    }
  }
  

  return true;
}